

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::PrintHeapBlockMemoryStats(Recycler *this,char16 *name,HeapBlockType type)

{
  size_t sVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  long lVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  long local_38;
  
  uVar2 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  sVar1 = (this->collectionStats).heapBlockFreeByteCount[uVar2];
  if (this->enablePartialCollect == true) {
    sVar4 = (this->collectionStats).smallNonLeafHeapBlockPartialReuseBytes[uVar2];
    local_38 = sVar1 - sVar4;
  }
  else {
    local_38 = 0;
    sVar4 = sVar1;
  }
  lVar3 = ((this->collectionStats).heapBlockCount[uVar2] -
           (this->collectionStats).heapBlockFreeCount[uVar2] <<
          (MediumAllocBlockTypeCount < type) * '\x03') * 0x1000;
  Output::Print(L" %6s: %10d %10d",name,lVar3 - sVar1,sVar4);
  if (((this->enablePartialCollect == true) && (type < LargeBlockType)) &&
     ((0x77aU >> (type & 0x1f) & 1) != 0)) {
    Output::Print(L" %10d",local_38);
  }
  else {
    Output::Print(L"           ");
  }
  auVar5._8_4_ = (int)(sVar4 >> 0x20);
  auVar5._0_8_ = sVar4;
  auVar5._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)((ulong)lVar3 >> 0x20);
  auVar8._0_8_ = lVar3;
  auVar8._12_4_ = 0x45300000;
  dVar7 = ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0) +
          (auVar8._8_8_ - 1.9342813113834067e+25);
  Output::Print(L" %10d %6.1f",
                ((((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0) +
                 (auVar5._8_8_ - 1.9342813113834067e+25)) / dVar7) * 100.0,lVar3);
  if (((this->enablePartialCollect == true) && (type < LargeBlockType)) &&
     ((0x77aU >> (type & 0x1f) & 1) != 0)) {
    auVar6._0_8_ = (double)CONCAT44(0x43300000,(int)local_38);
    auVar6._8_4_ = (int)((ulong)local_38 >> 0x20);
    auVar6._12_4_ = 0x45300000;
    Output::Print(L" %6.1f",
                  (((auVar6._0_8_ - 4503599627370496.0) + (auVar6._8_8_ - 1.9342813113834067e+25)) /
                  dVar7) * 100.0);
    return;
  }
  return;
}

Assistant:

void
Recycler::PrintHeapBlockMemoryStats(char16 const * name, HeapBlock::HeapBlockType type)
{
    size_t allocableFreeByteCount = collectionStats.heapBlockFreeByteCount[type];
#if ENABLE_PARTIAL_GC
    size_t partialUnusedBytes = 0;
    if (this->enablePartialCollect)
    {
        partialUnusedBytes = allocableFreeByteCount
            - collectionStats.smallNonLeafHeapBlockPartialReuseBytes[type];
        allocableFreeByteCount -= partialUnusedBytes;
    }
#endif
    size_t blockPages = type < HeapBlock::HeapBlockType::SmallAllocBlockTypeCount ?
        SmallAllocationBlockAttributes::PageCount : MediumAllocationBlockAttributes::PageCount;
    size_t totalByteCount = (collectionStats.heapBlockCount[type] - collectionStats.heapBlockFreeCount[type]) * blockPages * AutoSystemInfo::PageSize;
    size_t liveByteCount = totalByteCount - collectionStats.heapBlockFreeByteCount[type];
    Output::Print(_u(" %6s: %10d %10d"), name, liveByteCount, allocableFreeByteCount);

#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect &&
        (type == HeapBlock::HeapBlockType::SmallNormalBlockType
      || type == HeapBlock::HeapBlockType::SmallFinalizableBlockType
#ifdef RECYCLER_WRITE_BARRIER
      || type == HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType
      || type == HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType
#endif
      || type == HeapBlock::HeapBlockType::MediumNormalBlockType
      || type == HeapBlock::HeapBlockType::MediumFinalizableBlockType
#ifdef RECYCLER_WRITE_BARRIER
      || type == HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType
      || type == HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType
#endif
      ))
    {
        Output::Print(_u(" %10d"), partialUnusedBytes);
    }
    else
#endif
    {
        Output::Print(_u("           "));
    }

    Output::Print(_u(" %10d %6.1f"), totalByteCount,
        (double)allocableFreeByteCount / (double)totalByteCount * 100);

#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect &&
        (type == HeapBlock::HeapBlockType::SmallNormalBlockType
        || type == HeapBlock::HeapBlockType::SmallFinalizableBlockType
#ifdef RECYCLER_WRITE_BARRIER
        || type == HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType
        || type == HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType
#endif
        || type == HeapBlock::HeapBlockType::MediumNormalBlockType
        || type == HeapBlock::HeapBlockType::MediumFinalizableBlockType
#ifdef RECYCLER_WRITE_BARRIER
        || type == HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType
        || type == HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType
#endif
        ))
    {
        Output::Print(_u(" %6.1f"), (double)partialUnusedBytes / (double)totalByteCount * 100);
    }
#endif
}